

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O1

void nghttp2_pq_update(nghttp2_pq *pq,nghttp2_pq_item_cb fun,void *arg)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong index;
  bool bVar4;
  
  if (pq->length != 0) {
    if (pq->length == 0) {
      bVar4 = true;
      index = 0;
    }
    else {
      uVar3 = 0;
      uVar2 = 0;
      do {
        uVar1 = (*fun)(pq->q[uVar2],arg);
        uVar3 = uVar3 | uVar1;
        uVar2 = uVar2 + 1;
        index = pq->length;
      } while (uVar2 < index);
      bVar4 = uVar3 == 0;
    }
    if (index != 0 && !bVar4) {
      do {
        index = index - 1;
        bubble_down(pq,index);
      } while (index != 0);
    }
  }
  return;
}

Assistant:

void nghttp2_pq_update(nghttp2_pq *pq, nghttp2_pq_item_cb fun, void *arg) {
  size_t i;
  int rv = 0;
  if (pq->length == 0) {
    return;
  }
  for (i = 0; i < pq->length; ++i) {
    rv |= (*fun)(pq->q[i], arg);
  }
  if (rv) {
    for (i = pq->length; i > 0; --i) {
      bubble_down(pq, i - 1);
    }
  }
}